

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O1

void __thiscall btTriangleMesh::addIndex(btTriangleMesh *this,int index)

{
  int iVar1;
  uint *puVar2;
  unsigned_short *puVar3;
  uint *puVar4;
  unsigned_short *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  
  if (this->m_use32bitIndices == true) {
    piVar9 = &(this->m_32bitIndices).m_size;
    iVar6 = (this->m_32bitIndices).m_size;
    iVar1 = (this->m_32bitIndices).m_capacity;
    if (iVar6 == iVar1) {
      iVar8 = 1;
      if (iVar6 != 0) {
        iVar8 = iVar6 * 2;
      }
      if (iVar1 < iVar8) {
        if (iVar8 == 0) {
          puVar4 = (uint *)0x0;
        }
        else {
          puVar4 = (uint *)btAlignedAllocInternal((long)iVar8 << 2,0x10);
        }
        iVar6 = *piVar9;
        if (0 < (long)iVar6) {
          puVar2 = (this->m_32bitIndices).m_data;
          lVar7 = 0;
          do {
            puVar4[lVar7] = puVar2[lVar7];
            lVar7 = lVar7 + 1;
          } while (iVar6 != lVar7);
        }
        puVar2 = (this->m_32bitIndices).m_data;
        if (puVar2 != (uint *)0x0) {
          if ((this->m_32bitIndices).m_ownsMemory == true) {
            btAlignedFreeInternal(puVar2);
          }
          (this->m_32bitIndices).m_data = (uint *)0x0;
        }
        (this->m_32bitIndices).m_ownsMemory = true;
        (this->m_32bitIndices).m_data = puVar4;
        (this->m_32bitIndices).m_capacity = iVar8;
      }
    }
    puVar4 = (this->m_32bitIndices).m_data;
    puVar4[(this->m_32bitIndices).m_size] = index;
    iVar6 = (this->m_32bitIndices).m_size;
  }
  else {
    piVar9 = &(this->m_16bitIndices).m_size;
    iVar6 = (this->m_16bitIndices).m_size;
    iVar1 = (this->m_16bitIndices).m_capacity;
    if (iVar6 == iVar1) {
      iVar8 = 1;
      if (iVar6 != 0) {
        iVar8 = iVar6 * 2;
      }
      if (iVar1 < iVar8) {
        if (iVar8 == 0) {
          puVar5 = (unsigned_short *)0x0;
        }
        else {
          puVar5 = (unsigned_short *)btAlignedAllocInternal((long)iVar8 * 2,0x10);
        }
        iVar6 = *piVar9;
        if (0 < (long)iVar6) {
          puVar3 = (this->m_16bitIndices).m_data;
          lVar7 = 0;
          do {
            puVar5[lVar7] = puVar3[lVar7];
            lVar7 = lVar7 + 1;
          } while (iVar6 != lVar7);
        }
        puVar3 = (this->m_16bitIndices).m_data;
        if (puVar3 != (unsigned_short *)0x0) {
          if ((this->m_16bitIndices).m_ownsMemory == true) {
            btAlignedFreeInternal(puVar3);
          }
          (this->m_16bitIndices).m_data = (unsigned_short *)0x0;
        }
        (this->m_16bitIndices).m_ownsMemory = true;
        (this->m_16bitIndices).m_data = puVar5;
        (this->m_16bitIndices).m_capacity = iVar8;
      }
    }
    puVar4 = (uint *)(this->m_16bitIndices).m_data;
    iVar6 = (this->m_16bitIndices).m_size;
    *(short *)((long)puVar4 + (long)iVar6 * 2) = (short)index;
  }
  *piVar9 = iVar6 + 1;
  ((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_triangleIndexBase =
       (uchar *)puVar4;
  return;
}

Assistant:

void	btTriangleMesh::addIndex(int index)
{
	if (m_use32bitIndices)
	{
		m_32bitIndices.push_back(index);
		m_indexedMeshes[0].m_triangleIndexBase = (unsigned char*) &m_32bitIndices[0];
	} else
	{
		m_16bitIndices.push_back(index);
		m_indexedMeshes[0].m_triangleIndexBase = (unsigned char*) &m_16bitIndices[0];
	}
}